

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8c5559::ForcedKeyTestLarge_ForcedFrameIsKey_Test::TestBody
          (ForcedKeyTestLarge_ForcedFrameIsKey_Test *this)

{
  EncoderTest *pEVar1;
  uint uVar2;
  char cVar3;
  undefined8 uVar4;
  bool bVar5;
  int limit;
  pointer *__ptr;
  SEARCH_METHODS *message;
  long lVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  AssertHelper local_98;
  I420VideoSource video;
  
  pEVar1 = &(this->super_ForcedKeyTestLarge).super_EncoderTest;
  lVar6 = 0;
  while( true ) {
    (this->super_ForcedKeyTestLarge).frame_num_ = 0;
    uVar2 = *(uint *)((long)&DAT_00c53320 + lVar6);
    (this->super_ForcedKeyTestLarge).forced_kf_frame_num_ = uVar2 - 1;
    (this->super_ForcedKeyTestLarge).super_EncoderTest.cfg_.g_lag_in_frames = uVar2;
    (this->super_ForcedKeyTestLarge).is_kf_placement_violated_ = false;
    local_d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b;
    gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (_func_int **)&gtest_fatal_failure_checker.original_reporter_;
    gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (_func_int **)
         std::__cxx11::string::_M_create((ulong *)&gtest_fatal_failure_checker,(ulong)&local_d8);
    gtest_fatal_failure_checker.original_reporter_ =
         (TestPartResultReporterInterface *)local_d8._M_head_impl;
    builtin_strncpy((char *)((long)gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface + 0xb),"age_w352",8);
    builtin_strncpy((char *)((long)gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface + 0x13),"h288.yuv",8);
    *gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
     _vptr_TestPartResultReporterInterface = (_func_int *)0x635f6f72746e6168;
    gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface[1] = (_func_int *)0x775f6567616c6c6f;
    gtest_fatal_failure_checker._8_8_ = local_d8._M_head_impl;
    *((long)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
            _vptr_TestPartResultReporterInterface + local_d8._M_head_impl) =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>)0x0;
    limit = 0x3c;
    if ((this->super_ForcedKeyTestLarge).fwd_kf_enabled_ == 0) {
      limit = 0x1e;
    }
    libaom_test::YUVVideoSource::YUVVideoSource
              (&video.super_YUVVideoSource,(string *)&gtest_fatal_failure_checker,AOM_IMG_FMT_I420,
               0x160,0x120,0x1e,1,0,limit);
    video.super_YUVVideoSource.super_VideoSource._vptr_VideoSource =
         (_func_int **)&PTR__YUVVideoSource_01044d00;
    if ((TestPartResultReporterInterface **)
        gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface != &gtest_fatal_failure_checker.original_reporter_) {
      operator_delete(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface);
    }
    bVar5 = testing::internal::AlwaysTrue();
    if (!bVar5) break;
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar5 = testing::internal::AlwaysTrue();
    if (bVar5) {
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar5 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar5 != false) break;
    local_d8._M_head_impl = local_d8._M_head_impl & 0xffffffffffffff00;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&gtest_fatal_failure_checker,"is_kf_placement_violated_","false",
               &(this->super_ForcedKeyTestLarge).is_kf_placement_violated_,(bool *)&local_d8);
    cVar3 = (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface;
    if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
              _vptr_TestPartResultReporterInterface == '\0') {
      testing::Message::Message((Message *)&local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_d8._M_head_impl + 0x10),"Frame #",7);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_d8._M_head_impl + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_d8._M_head_impl + 0x10)," isn\'t a keyframe!",0x12);
      message = "";
      if (gtest_fatal_failure_checker._8_8_ != 0) {
        message = *(SEARCH_METHODS **)gtest_fatal_failure_checker._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
                 ,0x14e,(char *)message);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    uVar4 = gtest_fatal_failure_checker._8_8_;
    if (gtest_fatal_failure_checker._8_8_ != 0) {
      if (*(void **)gtest_fatal_failure_checker._8_8_ !=
          (void *)(gtest_fatal_failure_checker._8_8_ + 0x10)) {
        operator_delete(*(void **)gtest_fatal_failure_checker._8_8_);
      }
      operator_delete((void *)uVar4);
    }
    libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
    if (cVar3 == '\0') {
      return;
    }
    bVar5 = lVar6 == 8;
    lVar6 = lVar6 + 4;
    if (bVar5) {
      return;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/kf_test.cc"
             ,0x14d,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_d8,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

TEST_P(ForcedKeyTestLarge, ForcedFrameIsKey) { ForcedFrameIsKey(); }